

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Between.hpp
# Opt level: O2

string * __thiscall
ut11::Operands::IsBetween<int,_int>::GetErrorMessage<int>
          (string *__return_storage_ptr__,IsBetween<int,_int> *this,int *actual)

{
  ostream *poVar1;
  stringstream errorMessage;
  string sStack_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Expected between ");
  utility::ToString<int>(&local_1c8,this->low);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  poVar1 = std::operator<<(poVar1," and ");
  utility::ToString<int>(&local_1e8,this->high);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e8);
  poVar1 = std::operator<<(poVar1," but was ");
  utility::ToString<int>(&sStack_208,actual);
  std::operator<<(poVar1,(string *)&sStack_208);
  std::__cxx11::string::~string((string *)&sStack_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const Q& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected between " << ut11::utility::ToString(low) << " and " << ut11::utility::ToString(high) << " but was " << ut11::utility::ToString(actual);
				return errorMessage.str();
			}